

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O2

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<bool,_std::allocator<bool>_> *output)

{
  bool bVar1;
  int iVar2;
  AVSValue *pAVar3;
  undefined8 *puVar4;
  int index;
  AVSValue arg;
  
  iVar2 = NameToIndex(this,name);
  pAVar3 = AVSValue::operator[](&this->_args,iVar2);
  AVSValue::AVSValue(&arg,pAVar3);
  bVar1 = AVSValue::IsArray(&arg);
  if (bVar1) {
    iVar2 = AVSValue::ArraySize(&arg);
    *(undefined8 *)(output + 0x10) = *(undefined8 *)output;
    *(undefined4 *)(output + 0x18) = 0;
    index = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar2 != index; index = index + 1) {
      pAVar3 = AVSValue::operator[](&arg,index);
      bVar1 = AVSValue::AsBool(pAVar3);
      std::vector<bool,_std::allocator<bool>_>::push_back(output,bVar1);
    }
    AVSValue::~AVSValue(&arg);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "Argument is not array";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

void Read(const char* name, std::vector<bool>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsBool());
    }